

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status google::protobuf::json_internal::anon_unknown_5::
       ParseFieldMask<google::protobuf::json_internal::ParseProto3Type>
                 (JsonLexer *lex,Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
                 Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  Field in_RCX;
  size_t sVar5;
  char cVar6;
  char *in_R8;
  bool bVar7;
  string_view sVar8;
  string snake_path;
  const_iterator __begin3;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  undefined1 *local_108;
  Msg *local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_e8;
  size_t local_b8;
  Field local_b0;
  Field local_a8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_a0;
  MaybeOwnedString local_98;
  undefined1 local_68 [32];
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  local_a8 = in_RCX;
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)&local_a0.status_,(JsonLexer *)desc);
  (lex->stream_).stream_ = (ZeroCopyInputStream *)local_a0;
  if (((ulong)local_a0 & 1) == 0) {
    LOCK();
    *(int *)local_a0 = *(int *)local_a0 + 1;
    UNLOCK();
  }
  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
    if (local_a0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc9c5:
      uVar4 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_a0.status_);
      _Unwind_Resume(uVar4);
    }
    sVar8 = MaybeOwnedString::AsView(&local_98);
    if (sVar8._M_len == 0) {
LAB_002cc947:
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    else {
      local_b0 = Proto3Type::MustHaveField(msg,1);
      local_e8.splitter_ = &local_48;
      local_48.delimiter_.c_ = ',';
      local_e8.pos_ = 0;
      local_e8.state_ = kInitState;
      local_e8.curr_._M_len = 0;
      local_e8.curr_._M_str = (char *)0x0;
      local_e8.delimiter_.c_ = ',';
      local_48.text_ = sVar8;
      if (sVar8._M_str == (char *)0x0) {
        local_e8.state_ = kEndState;
        local_e8.pos_ = sVar8._M_len;
      }
      else {
        absl::lts_20240722::strings_internal::
        SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&local_e8);
      }
      local_b8 = local_48.text_._M_len;
      while( true ) {
        pcVar3 = local_e8.curr_._M_str;
        sVar2 = local_e8.curr_._M_len;
        if ((local_e8.state_ == kEndState) && (local_e8.pos_ == local_b8)) goto LAB_002cc947;
        local_108 = &local_f8;
        local_100 = (Msg *)0x0;
        local_f8 = 0;
        std::__cxx11::string::reserve((ulong)&local_108);
        bVar7 = sVar2 == 0;
        if (!bVar7) {
          sVar5 = 0;
          do {
            cVar1 = pcVar3[sVar5];
            cVar6 = (char)&local_108;
            if ((9 < (byte)(cVar1 - 0x30U)) && (cVar1 != '.' && 0x19 < (byte)(cVar1 + 0x9fU))) {
              if ((byte)(cVar1 + 0xbfU) < 0x1a) {
                std::__cxx11::string::push_back(cVar6);
              }
              else if (*(char *)((long)&(desc->raw_).field_0 + 0x40) == '\0') {
                if (local_a0 !=
                    (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x1) goto LAB_002cc9c5;
                JsonLocation::Invalid
                          ((JsonLocation *)lex,local_68,0x21,"unexpected character in FieldMask");
                if (local_108 != &local_f8) {
                  operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
                }
                goto LAB_002cc99c;
              }
            }
            std::__cxx11::string::push_back(cVar6);
            sVar5 = sVar5 + 1;
            bVar7 = sVar2 == sVar5;
          } while (!bVar7);
        }
        sVar8._M_str = in_R8;
        sVar8._M_len = (size_t)local_108;
        ParseProto3Type::SetString((ParseProto3Type *)local_b0,local_a8,local_100,sVar8);
        if (local_108 != &local_f8) {
          operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
        }
        if (!bVar7) break;
        absl::lts_20240722::strings_internal::
        SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&local_e8);
      }
    }
  }
LAB_002cc99c:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_a0.status_);
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseFieldMask(JsonLexer& lex, const Desc<Traits>& desc,
                            Msg<Traits>& msg) {
  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());
  auto paths = str->value.AsView();

  // The special case of the empty string is not handled correctly below,
  // because StrSplit("", ',') is [""], not [].
  if (paths.empty()) {
    return absl::OkStatus();
  }

  // google.protobuf.FieldMask has a single field with number 1.
  auto paths_field = Traits::MustHaveField(desc, 1);
  for (absl::string_view path : absl::StrSplit(paths, ',')) {
    std::string snake_path;
    // Assume approximately six-letter words, so add one extra space for an
    // underscore for every six bytes.
    snake_path.reserve(path.size() * 7 / 6);
    for (char c : path) {
      if (absl::ascii_isdigit(c) || absl::ascii_islower(c) || c == '.') {
        snake_path.push_back(c);
      } else if (absl::ascii_isupper(c)) {
        snake_path.push_back('_');
        snake_path.push_back(absl::ascii_tolower(c));
      } else if (lex.options().allow_legacy_syntax) {
        snake_path.push_back(c);
      } else {
        return str->loc.Invalid("unexpected character in FieldMask");
      }
    }
    Traits::SetString(paths_field, msg, snake_path);
  }

  return absl::OkStatus();
}